

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  bool bVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  SerialArena *arena;
  SerialArena *local_20;
  
  if ((((byte)this[8] & 2) == 0) && (bVar1 = GetSerialArenaFast(this,&local_20), bVar1)) {
    pVar2 = SerialArena::AllocateAlignedWithCleanup
                      (local_20,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
    return pVar2;
  }
  pVar2 = AllocateAlignedWithCleanupFallback(this,n,type);
  return pVar2;
}

Assistant:

std::pair<void*, SerialArena::CleanupNode*>
ThreadSafeArena::AllocateAlignedWithCleanup(size_t n,
                                            const std::type_info* type) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                            GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, alloc_policy_.get());
  } else {
    return AllocateAlignedWithCleanupFallback(n, type);
  }
}